

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_write_pcm_frames_be(drwav *pWav,drwav_uint64 framesToWrite,void *pData)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  drwav_uint32 dVar9;
  drwav_uint64 iSample;
  ulong uVar10;
  undefined1 *puVar11;
  size_t sVar12;
  drwav_uint64 dVar13;
  anon_union_8_2_947300a4 x;
  long lVar14;
  int iVar15;
  ulong __n;
  ulong uVar16;
  drwav_uint8 temp [4096];
  undefined8 local_1038;
  
  if (pData == (void *)0x0 || (framesToWrite == 0 || pWav == (drwav *)0x0)) {
    dVar13 = 0;
  }
  else {
    uVar3 = pWav->channels;
    uVar4 = pWav->bitsPerSample;
    dVar9 = drwav_get_bytes_per_pcm_frame(pWav);
    lVar14 = 0;
    uVar7 = (ulong)dVar9 / (ulong)uVar3;
    for (uVar16 = (ulong)uVar4 * framesToWrite * uVar3 >> 3; uVar16 != 0; uVar16 = uVar16 - sVar12)
    {
      uVar8 = 0x1000 / uVar7;
      __n = uVar8 * uVar7;
      if (uVar16 < uVar8 * uVar7) {
        __n = uVar16;
      }
      memcpy(&local_1038,pData,__n);
      uVar3 = pWav->translatedFormatTag;
      if (uVar3 - 6 < 2) {
        for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
          puVar1 = (ushort *)((long)&local_1038 + uVar10 * 2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        }
      }
      else {
        iVar15 = (int)uVar7;
        if (uVar3 == 1) {
          if (uVar7 == 2) {
            for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
              puVar1 = (ushort *)((long)&local_1038 + uVar10 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
          }
          else if (iVar15 == 3) {
            puVar11 = (undefined1 *)((long)&local_1038 + 2);
            for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
              uVar2 = puVar11[-2];
              puVar11[-2] = *puVar11;
              *puVar11 = uVar2;
              puVar11 = puVar11 + 3;
            }
          }
          else {
            if (iVar15 != 4) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                            ,0x553,
                            "void drwav__bswap_samples_pcm(void *, drwav_uint64, drwav_uint32)");
            }
            for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
              uVar5 = *(uint *)((long)&local_1038 + uVar10 * 4);
              *(uint *)((long)&local_1038 + uVar10 * 4) =
                   uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            }
          }
        }
        else {
          if (uVar3 != 3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                          ,0x58b,
                          "void drwav__bswap_samples(void *, drwav_uint64, drwav_uint32, drwav_uint16)"
                         );
          }
          if (uVar7 == 4) {
            for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
              uVar5 = *(uint *)((long)&local_1038 + uVar10 * 4);
              *(uint *)((long)&local_1038 + uVar10 * 4) =
                   uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
            }
          }
          else {
            if (iVar15 != 8) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                            ,0x56d,
                            "void drwav__bswap_samples_ieee(void *, drwav_uint64, drwav_uint32)");
            }
            for (uVar10 = 0; uVar10 < uVar8; uVar10 = uVar10 + 1) {
              uVar6 = (&local_1038)[uVar10];
              (&local_1038)[uVar10] =
                   uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                   (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                   (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 | (uVar6 & 0xff00) << 0x28
                   | uVar6 << 0x38;
            }
          }
        }
      }
      sVar12 = drwav_write_raw(pWav,__n,&local_1038);
      if (sVar12 == 0) break;
      lVar14 = lVar14 + sVar12;
      pData = (void *)((long)pData + sVar12);
    }
    dVar13 = ((ulong)(lVar14 << 3) / (ulong)pWav->bitsPerSample) / (ulong)pWav->channels;
  }
  return dVar13;
}

Assistant:

DRWAV_API drwav_uint64 drwav_write_pcm_frames_be(drwav* pWav, drwav_uint64 framesToWrite, const void* pData)
{
    drwav_uint64 bytesToWrite;
    drwav_uint64 bytesWritten;
    drwav_uint32 bytesPerSample;
    const drwav_uint8* pRunningData;

    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }

    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > DRWAV_SIZE_MAX) {
        return 0;
    }

    bytesWritten = 0;
    pRunningData = (const drwav_uint8*)pData;

    bytesPerSample = drwav_get_bytes_per_pcm_frame(pWav) / pWav->channels;
    
    while (bytesToWrite > 0) {
        drwav_uint8 temp[4096];
        drwav_uint32 sampleCount;
        size_t bytesJustWritten;
        drwav_uint64 bytesToWriteThisIteration;

        bytesToWriteThisIteration = bytesToWrite;
        DRWAV_ASSERT(bytesToWriteThisIteration <= DRWAV_SIZE_MAX);  /* <-- This is checked above. */

        /*
        WAV files are always little-endian. We need to byte swap on big-endian architectures. Since our input buffer is read-only we need
        to use an intermediary buffer for the conversion.
        */
        sampleCount = sizeof(temp)/bytesPerSample;

        if (bytesToWriteThisIteration > ((drwav_uint64)sampleCount)*bytesPerSample) {
            bytesToWriteThisIteration = ((drwav_uint64)sampleCount)*bytesPerSample;
        }

        DRWAV_COPY_MEMORY(temp, pRunningData, (size_t)bytesToWriteThisIteration);
        drwav__bswap_samples(temp, sampleCount, bytesPerSample, pWav->translatedFormatTag);

        bytesJustWritten = drwav_write_raw(pWav, (size_t)bytesToWriteThisIteration, temp);
        if (bytesJustWritten == 0) {
            break;
        }

        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }

    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}